

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O0

void init_stop(stop_t *record)

{
  stop_t *record_local;
  
  strcpy(record->id,"");
  strcpy(record->code,"");
  strcpy(record->name,"");
  strcpy(record->desc,"");
  record->lat = (longdouble)0;
  record->lon = (longdouble)0;
  strcpy(record->zone_id,"");
  strcpy(record->url,"");
  record->location_type = LT_STOP;
  strcpy(record->parent_station,"");
  strcpy(record->timezone,"");
  record->wheelchair_boarding = WB_UNKNOWN_OR_INHERITED;
  strcpy(record->level_id,"");
  strcpy(record->platform_code,"");
  return;
}

Assistant:

void init_stop(stop_t *record){
    strcpy(record->id, "");
    strcpy(record->code, "");
    strcpy(record->name, "");
    strcpy(record->desc, "");
    record->lat = 0.0;
    record->lon = 0.0;
    strcpy(record->zone_id, "");
    strcpy(record->url, "");
    record->location_type = LT_STOP;
    strcpy(record->parent_station, "");
    strcpy(record->timezone, "");
    record->wheelchair_boarding = WB_UNKNOWN_OR_INHERITED;
    strcpy(record->level_id, "");
    strcpy(record->platform_code, "");
}